

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circuit.cpp
# Opt level: O0

Am_Object find_obj_slot(int x,int y,Am_Object *ref_obj,bool source,Am_Slot_Key *slot,Places *place)

{
  byte bVar1;
  bool bVar2;
  Am_Value *pAVar3;
  ostream *poVar4;
  void *pvVar5;
  undefined7 in_register_00000009;
  undefined4 in_register_0000003c;
  Am_Object_Data *this;
  undefined4 *in_stack_00000008;
  byte local_9e;
  byte local_9a;
  Am_Object local_88;
  byte local_79;
  Am_Object local_78;
  Am_Object local_70;
  undefined4 local_68;
  byte local_61;
  Am_Object local_60 [3];
  undefined1 local_48 [8];
  Am_Value v;
  Am_Object obj;
  Am_Slot_Key *slot_local;
  bool source_local;
  Am_Object *ref_obj_local;
  int y_local;
  int x_local;
  
  this = (Am_Object_Data *)CONCAT44(in_register_0000003c,x);
  Am_Point_In_Part((Am_Object *)&v.value.bool_value,0x117468,y,
                   (Am_Object *)((ulong)ref_obj & 0xffffffff),source,false);
  Am_Value::Am_Value((Am_Value *)local_48);
  local_61 = 0;
  bVar1 = Am_Object::Valid();
  local_9a = 0;
  if ((bVar1 & 1) != 0) {
    Am_Object::Am_Object(local_60,(Am_Object *)&circuit_object_proto);
    local_61 = 1;
    local_9a = Am_Object::Is_Instance_Of((Am_Object *)&v.value.bool_value);
  }
  if ((local_61 & 1) != 0) {
    Am_Object::~Am_Object(local_60);
  }
  if ((local_9a & 1) == 0) {
    poVar4 = std::operator<<((ostream *)&std::cout,"** Wrong type obj for wire: ");
    pvVar5 = (void *)operator<<(poVar4,(Am_Object *)&v.value.bool_value);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  else {
    if (((ulong)slot & 1) != 0) {
      *(Am_Slot_Key *)place = OUTPUT_1;
      *in_stack_00000008 = 3;
      Am_Object::Am_Object((Am_Object *)this,(Am_Object *)&v.value.bool_value);
      goto LAB_00108f96;
    }
    local_79 = 0;
    Am_Object::Am_Object(&local_70,(Am_Object *)&zero_one_proto);
    bVar1 = Am_Object::Is_Instance_Of((Am_Object *)&v.value.bool_value);
    local_9e = 1;
    if ((bVar1 & 1) == 0) {
      Am_Object::Am_Object(&local_78,(Am_Object *)&not_proto);
      local_79 = 1;
      local_9e = Am_Object::Is_Instance_Of((Am_Object *)&v.value.bool_value);
    }
    if ((local_79 & 1) != 0) {
      Am_Object::~Am_Object(&local_78);
    }
    Am_Object::~Am_Object(&local_70);
    if ((local_9e & 1) == 0) {
      bVar2 = is_at_top((int)ref_obj,(Am_Object *)CONCAT71(in_register_00000009,source),
                        (Am_Object *)&v.value);
      if (bVar2) {
        *(Am_Slot_Key *)place = INPUT_1;
        *in_stack_00000008 = 1;
      }
      else {
        *(Am_Slot_Key *)place = INPUT_2;
        *in_stack_00000008 = 2;
      }
    }
    else {
      *(Am_Slot_Key *)place = INPUT_1;
      *in_stack_00000008 = 0;
    }
    pAVar3 = Am_Object::Peek((Am_Object *)&v.value,(short)*place,0);
    Am_Value::operator=((Am_Value *)local_48,(Am_Value *)pAVar3);
    bVar1 = Am_Value::Valid();
    if ((bVar1 & 1) == 0) {
      Am_Object::Am_Object((Am_Object *)this,(Am_Object *)&v.value.bool_value);
      goto LAB_00108f96;
    }
    poVar4 = std::operator<<((ostream *)&std::cout,"** Object at output end ");
    poVar4 = (ostream *)operator<<(poVar4,(Am_Object *)&v.value.bool_value);
    poVar4 = std::operator<<(poVar4," already has another object as input= ");
    pvVar5 = (void *)operator<<(poVar4,(Am_Object *)&v.value.bool_value);
    pvVar5 = (void *)std::ostream::operator<<(pvVar5,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar5,std::flush<char,std::char_traits<char>>);
  }
  Am_Object::Am_Object(&local_88,(Am_Object *)&circuit_win);
  Am_Beep((Am_Object *)&local_88);
  Am_Object::~Am_Object(&local_88);
  Am_Object::Am_Object((Am_Object *)this,(Am_Object *)&Am_No_Object);
LAB_00108f96:
  local_68 = 1;
  Am_Value::~Am_Value((Am_Value *)local_48);
  Am_Object::~Am_Object((Am_Object *)&v.value);
  return (Am_Object)this;
}

Assistant:

Am_Object find_obj_slot(int x, int y, Am_Object &ref_obj, bool source,
			Am_Slot_Key &slot, Places &place) {
  Am_Object obj = Am_Point_In_Part(created_objs, x, y, ref_obj);
  Am_Value v;
  if (obj.Valid() && obj.Is_Instance_Of(circuit_object_proto)) {
    if (source) {
      slot = OUTPUT_1;
      place = center_right;
      return obj;
    }
    else { // is destination
      if (obj.Is_Instance_Of(zero_one_proto) ||
	  obj.Is_Instance_Of(not_proto)) {
	slot = INPUT_1;
	place = center_left;
      }
      else {
	if (is_at_top(y, ref_obj, obj)) {
	  slot = INPUT_1;
	  place = top_left;
	}
	else {
	  slot = INPUT_2;
	  place = bottom_left;
	}
      }
      // destinations can only have one per place
      v = obj.Peek(slot);
      if (v.Valid()) 
	cout << "** Object at output end " << obj
	     << " already has another object as input= " << obj
	     << endl << flush;
      else return obj;
    }
  }
  else cout << "** Wrong type obj for wire: " << obj << endl << flush;
  //if get here, then failed
  Am_Beep(circuit_win);
  return Am_No_Object;
}